

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_points.cpp
# Opt level: O0

Am_Point_List * __thiscall
Am_Point_List::Add(Am_Point_List *this,float x,float y,Am_Add_Position position,bool unique)

{
  Am_Point_List_Data *this_00;
  bool unique_local;
  Am_Add_Position position_local;
  float y_local;
  float x_local;
  Am_Point_List *this_local;
  
  if (this->data == (Am_Point_List_Data *)0x0) {
    this_00 = (Am_Point_List_Data *)operator_new(0x20);
    Am_Point_List_Data::Am_Point_List_Data(this_00);
    this->data = this_00;
  }
  else if (unique) {
    Am_Point_List_Data::Make_Unique(this->data,&this->data,&this->item);
  }
  Am_Point_List_Data::Add(this->data,x,y,position);
  return this;
}

Assistant:

Am_Point_List &
Am_Point_List::Add(float x, float y, Am_Add_Position position, bool unique)
{
  if (data) {
    if (unique)
      data->Make_Unique(data, item);
  } else
    data = new Am_Point_List_Data();
  data->Add(x, y, position);
  return *this;
}